

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int rludecomp(double *A,int M,int N,int *ipiv)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  int iVar10;
  double *pdVar11;
  int iVar12;
  double *pdVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  uVar2 = 0;
  uVar7 = 0;
  if (0 < M) {
    uVar7 = (ulong)(uint)M;
  }
  for (; uVar7 != uVar2; uVar2 = uVar2 + 1) {
    ipiv[uVar2] = (int)uVar2;
  }
  if (N < M) {
    lVar5 = (long)N;
    uVar2 = 0;
    uVar7 = 0;
    if (0 < N) {
      uVar7 = (ulong)(uint)N;
    }
    iVar6 = 1;
    pdVar11 = A;
    pdVar9 = A;
    for (; uVar2 != uVar7; uVar2 = uVar2 + 1) {
      uVar15 = (ulong)iVar6;
      pdVar14 = (double *)((lVar5 * 8 + 8) * uVar15 + (long)A);
      pdVar13 = (double *)(lVar5 * 8 * uVar15 + (long)pdVar11);
      dVar17 = A[uVar2 * lVar5 + uVar2];
      dVar18 = ABS(dVar17);
      uVar4 = uVar2 & 0xffffffff;
      for (uVar8 = uVar15; (long)uVar8 < (long)M; uVar8 = uVar8 + 1) {
        dVar19 = ABS(*pdVar13);
        if (dVar18 < dVar19) {
          uVar4 = uVar8 & 0xffffffff;
        }
        uVar16 = -(ulong)(dVar18 < dVar19);
        dVar18 = (double)(~uVar16 & (ulong)dVar18 | (ulong)*pdVar13 & uVar16);
        pdVar13 = pdVar13 + lVar5;
      }
      iVar10 = (int)uVar4;
      if (uVar2 != uVar4) {
        iVar12 = ipiv[iVar10];
        ipiv[iVar10] = ipiv[uVar2];
        ipiv[uVar2] = iVar12;
        for (uVar8 = 0; (uint)N != uVar8; uVar8 = uVar8 + 1) {
          dVar17 = pdVar9[uVar8];
          pdVar9[uVar8] = A[(long)(iVar10 * N) + uVar8];
          A[(long)(iVar10 * N) + uVar8] = dVar17;
        }
        dVar17 = A[uVar2 * lVar5 + uVar2];
      }
      uVar8 = uVar15;
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        for (; (long)uVar8 < (long)M; uVar8 = uVar8 + 1) {
          dVar18 = A[uVar2 + uVar8 * lVar5];
          A[uVar2 + uVar8 * lVar5] = dVar18 / dVar17;
          pdVar13 = pdVar14;
          for (uVar4 = uVar15; (long)uVar4 < lVar5; uVar4 = uVar4 + 1) {
            *pdVar13 = pdVar9[uVar4] * -(dVar18 / dVar17) + *pdVar13;
            pdVar13 = pdVar13 + 1;
          }
          pdVar14 = pdVar14 + lVar5;
        }
      }
      iVar6 = iVar6 + 1;
      pdVar11 = pdVar11 + 1;
      pdVar9 = pdVar9 + lVar5;
    }
  }
  else if (M < N) {
    lVar5 = (long)N;
    uVar2 = 0;
    uVar7 = 0;
    if (0 < N) {
      uVar7 = (ulong)(uint)N;
    }
    iVar6 = 1;
    iVar10 = M;
    if (M < 2) {
      iVar10 = 1;
    }
    pdVar11 = A + lVar5;
    pdVar9 = A;
    pdVar13 = A;
    for (; uVar2 != iVar10 - 1; uVar2 = uVar2 + 1) {
      dVar17 = A[uVar2 * lVar5 + uVar2];
      dVar18 = ABS(dVar17);
      uVar4 = uVar2 & 0xffffffff;
      uVar15 = (ulong)iVar6;
      pdVar14 = pdVar11;
      for (uVar8 = uVar15; (long)uVar8 < (long)M; uVar8 = uVar8 + 1) {
        dVar19 = ABS(*pdVar14);
        if (dVar18 < dVar19) {
          uVar4 = uVar8 & 0xffffffff;
        }
        uVar16 = -(ulong)(dVar18 < dVar19);
        dVar18 = (double)(~uVar16 & (ulong)dVar18 | (ulong)*pdVar14 & uVar16);
        pdVar14 = pdVar14 + lVar5;
      }
      iVar12 = (int)uVar4;
      if (uVar2 != uVar4) {
        iVar1 = ipiv[iVar12];
        ipiv[iVar12] = ipiv[uVar2];
        ipiv[uVar2] = iVar1;
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          dVar17 = pdVar9[uVar8];
          pdVar9[uVar8] = A[(long)(iVar12 * N) + uVar8];
          A[(long)(iVar12 * N) + uVar8] = dVar17;
        }
        dVar17 = A[uVar2 * lVar5 + uVar2];
      }
      pdVar14 = pdVar11;
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        for (; (long)uVar15 < (long)M; uVar15 = uVar15 + 1) {
          dVar18 = A[uVar2 + uVar15 * lVar5];
          A[uVar2 + uVar15 * lVar5] = dVar18 / dVar17;
          for (lVar3 = 1; (long)(uVar2 + lVar3) < lVar5; lVar3 = lVar3 + 1) {
            pdVar14[lVar3] = pdVar13[lVar3] * -(dVar18 / dVar17) + pdVar14[lVar3];
          }
          pdVar14 = pdVar14 + lVar5;
        }
      }
      iVar6 = iVar6 + 1;
      pdVar11 = pdVar11 + lVar5 + 1;
      pdVar9 = pdVar9 + lVar5;
      pdVar13 = pdVar13 + lVar5 + 1;
    }
  }
  else if (M == N) {
    pludecomp(A,M,ipiv);
  }
  return 0;
}

Assistant:

int rludecomp(double *A, int M, int N, int *ipiv) {
	int k, j, l, c1, c2, mind, tempi;
	double ld, mult, mval, temp;


	for (k = 0; k < M; ++k)
		ipiv[k] = (double) k;

	if (M > N) {
		for (k = 0; k < N; ++k) {
			mval = fabs(A[k*N + k]);
			mind = k;
			for (j = k + 1; j < M; ++j) {
				if (mval < fabs(A[j*N + k])) {
					mval = A[j*N + k];
					mind = j;
				}
			}

			if (mind != k) {
				c1 = k *N;
				c2 = mind * N;
				tempi = ipiv[mind];
				ipiv[mind] = ipiv[k];
				ipiv[k] = tempi;
				for (j = 0; j < N; j++) {
					temp = A[c1 + j];
					*(A + c1 + j) = *(A + c2 + j);
					*(A + c2 + j) = temp;
				}
			}

			c2 = k*N;
			ld = A[c2 + k];
			if (ld != 0. && k < N) {
				for (j = k + 1; j < M; ++j) {
					c1 = j*N;
					mult = A[c1 + k] /= ld;
					//printf("\n k %d j %d mult %f \n",k,j,mult);
					for (l = k + 1; l < N; ++l) {
						A[c1 + l] -= mult * A[c2 + l];
					}
				}
			}
		}
	}
	else if (M < N) {
		for (k = 0; k < M-1; ++k) {
			mval = fabs(A[k*N + k]);
			mind = k;
			for (j = k + 1; j < M; ++j) {
				if (mval < fabs(A[j*N + k])) {
					mval = A[j*N + k];
					mind = j;
				}
			}

			if (mind != k) {
				c1 = k *N;
				c2 = mind * N;
				tempi = ipiv[mind];
				ipiv[mind] = ipiv[k];
				ipiv[k] = tempi;
				for (j = 0; j < N; j++) {
					temp = A[c1 + j];
					*(A + c1 + j) = *(A + c2 + j);
					*(A + c2 + j) = temp;
				}
			}

			c2 = k*N;
			ld = A[c2 + k];
			if (ld != 0.) {
				for (j = k + 1; j < M; ++j) {
					c1 = j*N;
					mult = A[c1 + k] /= ld;
					//printf("\n k %d j %d mult %f \n",k,j,mult);
					for (l = k + 1; l < N; ++l) {
						A[c1 + l] -= mult * A[c2 + l];
					}
				}
			}
		}
	}
	else if (M == N) {
		pludecomp(A,N,ipiv);
	}

	//mdisplay(ipiv, 1, M);

	return 0;

	
}